

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O3

pair<int,_void_*> __thiscall
uWS::HttpParser::fenceAndConsumePostPadded<1>
          (HttpParser *this,char *data,int length,void *user,HttpRequest *req,
          unique_function<void_*(void_*,_HttpRequest_*)> *requestHandler,
          unique_function<void_*(void_*,_std::string_view,_bool)> *dataHandler)

{
  char *__s;
  uint uVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_*(void_*,_uWS::HttpRequest_*)>_>
  *parent;
  size_t __n;
  Header *pHVar7;
  string_view lowerCasedHeader;
  string_view sVar8;
  pair<int,_void_*> pVar9;
  
  data[length] = '\r';
  if (length != 0) {
    uVar1 = getHeaders(data,data + length,req->headers,&req->bf);
    if (uVar1 != 0) {
      iVar2 = (int)req->headers[0].value._M_len;
      iVar5 = 9;
      if (9 < iVar2) {
        iVar5 = iVar2;
      }
      __n = (size_t)(iVar5 - 9);
      req->headers[0].value._M_len = __n;
      sVar4 = req->headers[1].key._M_len;
      if (sVar4 != 0) {
        pHVar7 = req->headers + 2;
        do {
          sVar8._M_str = pHVar7[-1].key._M_str;
          sVar8._M_len = sVar4;
          BloomFilter::add(&req->bf,sVar8);
          sVar4 = (pHVar7->key)._M_len;
          pHVar7 = pHVar7 + 1;
        } while (sVar4 != 0);
        __n = req->headers[0].value._M_len;
      }
      __s = req->headers[0].value._M_str;
      pvVar3 = memchr(__s,0x3f,__n);
      iVar5 = (int)__s;
      iVar2 = (int)pvVar3;
      if (pvVar3 == (void *)0x0) {
        iVar2 = (int)__n + iVar5;
      }
      req->querySeparator = iVar2 - iVar5;
      pvVar3 = (*(requestHandler->erasure_).vtable_.vtable_)
                         ((data_accessor *)requestHandler,0x10,user,req);
      if (pvVar3 == user) {
        lowerCasedHeader._M_str = "content-length";
        lowerCasedHeader._M_len = 0xe;
        sVar8 = HttpRequest::getHeader(req,lowerCasedHeader);
        if (sVar8._M_len == 0) {
          (*(dataHandler->erasure_).vtable_.vtable_)
                    ((data_accessor *)dataHandler,0x10,user,
                     (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0),true);
          pvVar3 = user;
        }
        else {
          sVar4 = 0;
          uVar6 = 0;
          do {
            uVar6 = ((uint)(byte)sVar8._M_str[sVar4] + uVar6 * 10) - 0x30;
            sVar4 = sVar4 + 1;
          } while (sVar8._M_len != sVar4);
          this->remainingStreamingBytes = uVar6;
        }
      }
      goto LAB_0013f737;
    }
  }
  uVar1 = 0;
  pvVar3 = user;
LAB_0013f737:
  pVar9._4_4_ = 0;
  pVar9.first = uVar1;
  pVar9.second = pvVar3;
  return pVar9;
}

Assistant:

std::pair<int, void *> fenceAndConsumePostPadded(char *data, int length, void *user, HttpRequest *req, fu2::unique_function<void *(void *, HttpRequest *)> &requestHandler, fu2::unique_function<void *(void *, std::string_view, bool)> &dataHandler) {
        int consumedTotal = 0;
        data[length] = '\r';

        for (int consumed; length && (consumed = getHeaders(data, data + length, req->headers, &req->bf)); ) {
            data += consumed;
            length -= consumed;
            consumedTotal += consumed;

            /* Strip away tail of first "header value" aka URL */
            req->headers->value = std::string_view(req->headers->value.data(), std::max<int>(0, (int) req->headers->value.length() - 9));

            /* Add all headers to bloom filter */
            for (HttpRequest::Header *h = req->headers; (++h)->key.length(); ) {
                req->bf.add(h->key);
            }

            /* Parse query */
            const char *querySeparatorPtr = (const char *) memchr(req->headers->value.data(), '?', req->headers->value.length());
            req->querySeparator = (int) ((querySeparatorPtr ? querySeparatorPtr : req->headers->value.data() + req->headers->value.length()) - req->headers->value.data());

            /* If returned socket is not what we put in we need
             * to break here as we either have upgraded to
             * WebSockets or otherwise closed the socket. */
            void *returnedUser = requestHandler(user, req);
            if (returnedUser != user) {
                /* We are upgraded to WebSocket or otherwise broken */
                return {consumedTotal, returnedUser};
            }

            // todo: do not check this for GET (get should not have a body)
            // todo: also support reading chunked streams
            std::string_view contentLengthString = req->getHeader("content-length");
            if (contentLengthString.length()) {
                remainingStreamingBytes = toUnsignedInteger(contentLengthString);

                if (!CONSUME_MINIMALLY) {
                    unsigned int emittable = std::min<unsigned int>(remainingStreamingBytes, length);
                    dataHandler(user, std::string_view(data, emittable), emittable == remainingStreamingBytes);
                    remainingStreamingBytes -= emittable;

                    data += emittable;
                    length -= emittable;
                    consumedTotal += emittable;
                }
            } else {
                /* Still emit an empty data chunk to signal no data */
                dataHandler(user, {}, true);
            }

            if (CONSUME_MINIMALLY) {
                break;
            }
        }
        return {consumedTotal, user};
    }